

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::asio_rpc_listener::stop(asio_rpc_listener *this)

{
  int __fd;
  mutex_type *in_RDI;
  lock_guard<std::mutex> guard;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  
  __fd = (int)in_RDI + 0x30;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI[2].super___mutex_base._M_mutex.__size[0x18] = '\x01';
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::close
            ((basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)
             &in_RDI[2].super___mutex_base._M_mutex.__data.__list.__next,__fd);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x28abcd);
  return;
}

Assistant:

virtual void stop() override {
        auto_lock(listener_lock_);
        stopped_ = true;
        acceptor_.close();
    }